

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

void __thiscall gui::Group::draw(Group *this,RenderTarget *target,RenderStates states)

{
  Widget *this_00;
  pointer psVar1;
  bool bVar2;
  Transform *right;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *pvVar3;
  shared_ptr<gui::Widget> *child;
  pointer psVar4;
  
  this_00 = &(this->super_Container).super_Widget;
  bVar2 = Widget::isVisible(this_00);
  if (bVar2) {
    right = Widget::getTransform(this_00);
    sf::operator*=(&states.transform,right);
    pvVar3 = ContainerBase::getChildren((ContainerBase *)this);
    psVar1 = (pvVar3->
             super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (pvVar3->
                  super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      sf::RenderTarget::draw
                (target,&((psVar4->super___shared_ptr<gui::Widget,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->super_Drawable,&states);
    }
  }
  return;
}

Assistant:

void Group::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    for (const auto& child : getChildren()) {
        target.draw(*child, states);
    }
}